

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::int_writer<char,_fmt::v5::basic_format_specs<char>_>::int_writer
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this,
          basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
          *w,char value,basic_format_specs<char> *s)

{
  byte bVar1;
  char cVar2;
  unsigned_type uVar3;
  undefined7 in_register_00000011;
  
  this->writer = w;
  this->spec = s;
  uVar3 = (unsigned_type)CONCAT71(in_register_00000011,value);
  this->abs_value = uVar3;
  this->prefix_size = 0;
  if (-1 < value) {
    bVar1 = (s->super_core_format_specs).flags;
    if ((bVar1 & 1) != 0) {
      cVar2 = '+';
      if ((bVar1 & 2) == 0) {
        cVar2 = ' ';
      }
      this->prefix[0] = cVar2;
      this->prefix_size = 1;
    }
    return;
  }
  this->prefix[0] = '-';
  this->prefix_size = 1;
  this->abs_value = -uVar3;
  return;
}

Assistant:

int_writer(basic_writer<Range> &w, Int value, const Spec &s)
      : writer(w), spec(s), abs_value(static_cast<unsigned_type>(value)),
        prefix_size(0) {
      if (internal::is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (spec.has(SIGN_FLAG)) {
        prefix[0] = spec.has(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
      }
    }